

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# esextcDrawBuffersIndexedColorMasks.cpp
# Opt level: O0

GLenum __thiscall
glcts::DrawBuffersIndexedColorMasks::ReadableType(DrawBuffersIndexedColorMasks *this,GLenum format)

{
  GLenum format_local;
  DrawBuffersIndexedColorMasks *this_local;
  
  if ((((format == 0x8051) || (format - 0x8056 < 4)) || (format == 0x8229)) || (format == 0x822b)) {
    return 0x1401;
  }
  if (format == 0x8231) {
LAB_01572162:
    this_local._4_4_ = 0x1404;
  }
  else {
    if (format != 0x8232) {
      if (format == 0x8233) goto LAB_01572162;
      if (format != 0x8234) {
        if (format == 0x8235) goto LAB_01572162;
        if (format != 0x8236) {
          if (format == 0x8237) goto LAB_01572162;
          if (format != 0x8238) {
            if (format == 0x8239) goto LAB_01572162;
            if (format != 0x823a) {
              if (format == 0x823b) goto LAB_01572162;
              if (format != 0x823c) {
                if (format == 0x8d62) {
                  return 0x1401;
                }
                if (((format != 0x8d70) && (format != 0x8d76)) && (format != 0x8d7c)) {
                  if (((format == 0x8d82) || (format == 0x8d88)) || (format == 0x8d8e))
                  goto LAB_01572162;
                  if (format != 0x906f) {
                    return 0;
                  }
                }
              }
            }
          }
        }
      }
    }
    this_local._4_4_ = 0x1405;
  }
  return this_local._4_4_;
}

Assistant:

glw::GLenum DrawBuffersIndexedColorMasks::ReadableType(glw::GLenum format)
{
	switch (format)
	{
	case GL_R8:
	case GL_RG8:
	case GL_RGB8:
	case GL_RGB565:
	case GL_RGBA4:
	case GL_RGB5_A1:
	case GL_RGBA8:
	case GL_RGB10_A2:
		return GL_UNSIGNED_BYTE;

	case GL_R8I:
	case GL_R16I:
	case GL_R32I:
	case GL_RG8I:
	case GL_RG16I:
	case GL_RG32I:
	case GL_RGBA8I:
	case GL_RGBA16I:
	case GL_RGBA32I:
		return GL_INT;

	case GL_R8UI:
	case GL_R16UI:
	case GL_R32UI:
	case GL_RG8UI:
	case GL_RG16UI:
	case GL_RG32UI:
	case GL_RGB10_A2UI:
	case GL_RGBA8UI:
	case GL_RGBA16UI:
	case GL_RGBA32UI:
		return GL_UNSIGNED_INT;

	default:
		return 0;
	}
}